

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O3

uint32_t GoodOAAT(char *key,int len,uint32_t seed)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uchar *str;
  
  uVar2 = seed >> 0x11 | seed << 0xf;
  uVar3 = seed ^ 0x3b00;
  if (len != 0) {
    lVar4 = 0;
    do {
      pbVar1 = (byte *)(key + lVar4);
      lVar4 = lVar4 + 1;
      uVar3 = (*pbVar1 + uVar3) * 9;
      uVar2 = (uVar2 + uVar3 >> 0x19 | (uVar2 + uVar3) * 0x80) * 5;
    } while (len != lVar4);
  }
  uVar3 = (uVar2 >> 0x12 | uVar2 << 0xe) + (uVar3 ^ uVar2);
  uVar2 = (uVar3 >> 6 | uVar3 * 0x4000000) + (uVar2 ^ uVar3);
  uVar3 = (uVar2 >> 0x1b | uVar2 * 0x20) + (uVar3 ^ uVar2);
  return (uVar3 >> 8 | uVar3 * 0x1000000) + (uVar2 ^ uVar3);
}

Assistant:

uint32_t
GoodOAAT(const char *key, int len, uint32_t seed) {
#define grol(x,n) (((x)<<(n))|((x)>>(32-(n))))
#define gror(x,n) (((x)>>(n))|((x)<<(32-(n))))
  unsigned char  *str = (unsigned char *)key;
  const unsigned char *const end = (const unsigned char *)str + len;
  uint32_t h1 = seed ^ 0x3b00;
  uint32_t h2 = grol(seed, 15);
  for (;str != end; str++) {
    h1 += str[0];
    h1 += h1 << 3; // h1 *= 9
    h2 += h1;
    // the rest could be as in MicroOAAT: h1 = grol(h1, 7)
    // but clang doesn't generate ROTL instruction then.
    h2 = grol(h2, 7);
    h2 += h2 << 2; // h2 *= 5
  }
  h1 ^= h2;
  /* now h1 passes all collision checks,
   * so it is suitable for hash-tables with prime numbers. */
  h1 += grol(h2, 14);
  h2 ^= h1; h2 += gror(h1, 6);
  h1 ^= h2; h1 += grol(h2, 5);
  h2 ^= h1; h2 += gror(h1, 8);
  return h2;
#undef grol
#undef gror
}